

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicy.cpp
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
pgi::JointPolicy::joint_vertices
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          JointPolicy *this)

{
  _Base_ptr p_Var1;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var1 = (this->stepmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->stepmap)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (__return_storage_ptr__,(value_type_conflict2 *)(p_Var1 + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<JointPolicy::joint_vertex_t> JointPolicy::joint_vertices() const {
  std::vector<joint_vertex_t> v;
  for (const auto& mit : stepmap) {
    v.push_back(mit.first);
  }
  return v;
}